

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GraphicsTypesX.hpp
# Opt level: O3

void __thiscall
Diligent::
PipelineStateCreateInfoX<Diligent::TilePipelineStateCreateInfoX,_Diligent::TilePipelineStateCreateInfo>
::PipelineStateCreateInfoX
          (PipelineStateCreateInfoX<Diligent::TilePipelineStateCreateInfoX,_Diligent::TilePipelineStateCreateInfo>
           *this,TilePipelineStateCreateInfo *CI)

{
  PipelineResourceLayoutDescX *this_00;
  IPipelineStateCache *pPipelineStateCache;
  Uint32 UVar1;
  undefined4 uVar2;
  SHADER_RESOURCE_VARIABLE_TYPE SVar3;
  undefined3 uVar4;
  SHADER_TYPE SVar5;
  Uint32 UVar6;
  undefined4 uVar7;
  long lVar8;
  TilePipelineStateCreateInfo *pTVar9;
  PipelineStateCreateInfoX<Diligent::TilePipelineStateCreateInfoX,_Diligent::TilePipelineStateCreateInfo>
  *pPVar10;
  ulong uVar11;
  pair<std::__detail::_Node_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_true>,_bool>
  pVar12;
  Char *local_28;
  
  pTVar9 = CI;
  pPVar10 = this;
  for (lVar8 = 0x10; lVar8 != 0; lVar8 = lVar8 + -1) {
    (pPVar10->super_TilePipelineStateCreateInfo).super_PipelineStateCreateInfo.PSODesc.
    super_DeviceObjectAttribs.Name =
         (pTVar9->super_PipelineStateCreateInfo).PSODesc.super_DeviceObjectAttribs.Name;
    pTVar9 = (TilePipelineStateCreateInfo *)
             &(pTVar9->super_PipelineStateCreateInfo).PSODesc.PipelineType;
    pPVar10 = (PipelineStateCreateInfoX<Diligent::TilePipelineStateCreateInfoX,_Diligent::TilePipelineStateCreateInfo>
               *)&(pPVar10->super_TilePipelineStateCreateInfo).super_PipelineStateCreateInfo.PSODesc
                  .PipelineType;
  }
  this_00 = &this->ResourceLayout;
  PipelineResourceLayoutDescX::PipelineResourceLayoutDescX
            (this_00,&(CI->super_PipelineStateCreateInfo).PSODesc.ResourceLayout);
  (this->StringPool)._M_h._M_buckets = &(this->StringPool)._M_h._M_single_bucket;
  (this->StringPool)._M_h._M_bucket_count = 1;
  (this->StringPool)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->StringPool)._M_h._M_element_count = 0;
  (this->StringPool)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->StringPool)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->StringPool)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (this->Objects).
  super__Vector_base<Diligent::RefCntAutoPtr<Diligent::IDeviceObject>,_std::allocator<Diligent::RefCntAutoPtr<Diligent::IDeviceObject>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->Objects).
  super__Vector_base<Diligent::RefCntAutoPtr<Diligent::IDeviceObject>,_std::allocator<Diligent::RefCntAutoPtr<Diligent::IDeviceObject>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->Objects).
  super__Vector_base<Diligent::RefCntAutoPtr<Diligent::IDeviceObject>,_std::allocator<Diligent::RefCntAutoPtr<Diligent::IDeviceObject>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->Signatures).
  super__Vector_base<Diligent::IPipelineResourceSignature_*,_std::allocator<Diligent::IPipelineResourceSignature_*>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->Signatures).
  super__Vector_base<Diligent::IPipelineResourceSignature_*,_std::allocator<Diligent::IPipelineResourceSignature_*>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->Signatures).
  super__Vector_base<Diligent::IPipelineResourceSignature_*,_std::allocator<Diligent::IPipelineResourceSignature_*>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  CopyPSOCreateInternalInfo
            ((Diligent *)&this->InternalData,(CI->super_PipelineStateCreateInfo).pInternalData);
  local_28 = (this->super_TilePipelineStateCreateInfo).super_PipelineStateCreateInfo.PSODesc.
             super_DeviceObjectAttribs.Name;
  if (local_28 != (Char *)0x0) {
    pVar12 = std::
             _Hashtable<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
             ::_M_emplace<char_const*&>
                       ((_Hashtable<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                         *)&this->StringPool,&local_28);
    (this->super_TilePipelineStateCreateInfo).super_PipelineStateCreateInfo.PSODesc.
    super_DeviceObjectAttribs.Name =
         *(Char **)((long)pVar12.first.
                          super__Node_iterator_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                          ._M_cur.
                          super__Node_iterator_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                   + 8);
  }
  if ((CI->super_PipelineStateCreateInfo).ResourceSignaturesCount != 0) {
    uVar11 = 0;
    do {
      AddSignature(this,(CI->super_PipelineStateCreateInfo).ppResourceSignatures[uVar11]);
      uVar11 = uVar11 + 1;
    } while (uVar11 < (CI->super_PipelineStateCreateInfo).ResourceSignaturesCount);
  }
  pPipelineStateCache = (CI->super_PipelineStateCreateInfo).pPSOCache;
  if (pPipelineStateCache != (IPipelineStateCache *)0x0) {
    SetPipelineStateCache(this,pPipelineStateCache);
  }
  (this->super_TilePipelineStateCreateInfo).super_PipelineStateCreateInfo.PSODesc.ResourceLayout.
  ImmutableSamplers = (this->ResourceLayout).super_PipelineResourceLayoutDesc.ImmutableSamplers;
  SVar3 = (this_00->super_PipelineResourceLayoutDesc).DefaultVariableType;
  uVar4 = *(undefined3 *)&(this_00->super_PipelineResourceLayoutDesc).field_0x1;
  SVar5 = (this_00->super_PipelineResourceLayoutDesc).DefaultVariableMergeStages;
  UVar6 = (this->ResourceLayout).super_PipelineResourceLayoutDesc.NumVariables;
  uVar7 = *(undefined4 *)&(this->ResourceLayout).super_PipelineResourceLayoutDesc.field_0xc;
  UVar1 = (this->ResourceLayout).super_PipelineResourceLayoutDesc.NumImmutableSamplers;
  uVar2 = *(undefined4 *)&(this->ResourceLayout).super_PipelineResourceLayoutDesc.field_0x1c;
  (this->super_TilePipelineStateCreateInfo).super_PipelineStateCreateInfo.PSODesc.ResourceLayout.
  Variables = (this->ResourceLayout).super_PipelineResourceLayoutDesc.Variables;
  (this->super_TilePipelineStateCreateInfo).super_PipelineStateCreateInfo.PSODesc.ResourceLayout.
  NumImmutableSamplers = UVar1;
  *(undefined4 *)
   &(this->super_TilePipelineStateCreateInfo).super_PipelineStateCreateInfo.PSODesc.ResourceLayout.
    field_0x1c = uVar2;
  pTVar9 = &this->super_TilePipelineStateCreateInfo;
  (pTVar9->super_PipelineStateCreateInfo).PSODesc.ResourceLayout.DefaultVariableType = SVar3;
  *(undefined3 *)&(pTVar9->super_PipelineStateCreateInfo).PSODesc.ResourceLayout.field_0x1 = uVar4;
  (pTVar9->super_PipelineStateCreateInfo).PSODesc.ResourceLayout.DefaultVariableMergeStages = SVar5;
  (this->super_TilePipelineStateCreateInfo).super_PipelineStateCreateInfo.PSODesc.ResourceLayout.
  NumVariables = UVar6;
  *(undefined4 *)
   &(this->super_TilePipelineStateCreateInfo).super_PipelineStateCreateInfo.PSODesc.ResourceLayout.
    field_0xc = uVar7;
  (this->super_TilePipelineStateCreateInfo).super_PipelineStateCreateInfo.pInternalData =
       (this->InternalData)._M_t.
       super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>._M_t.
       super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>.
       super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl;
  return;
}

Assistant:

PipelineStateCreateInfoX(const CreateInfoType& CI) noexcept :
        CreateInfoType{CI},
        ResourceLayout{CI.PSODesc.ResourceLayout},
        InternalData{CopyPSOCreateInternalInfo(CI.pInternalData)}
    {
        SetName(this->PSODesc.Name);
        for (size_t i = 0; i < CI.ResourceSignaturesCount; ++i)
            AddSignature(CI.ppResourceSignatures[i]);
        if (CI.pPSOCache != nullptr)
            SetPipelineStateCache(CI.pPSOCache);
        this->PSODesc.ResourceLayout = ResourceLayout;
        this->pInternalData          = InternalData.get();
    }